

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanTypeConversions.cpp
# Opt level: O1

ADAPTER_TYPE Diligent::VkPhysicalDeviceTypeToAdapterType(VkPhysicalDeviceType DeviceType)

{
  ADAPTER_TYPE AVar1;
  
  AVar1 = (ADAPTER_TYPE)(0x100030200 >> ((char)DeviceType * '\b' & 0x3fU));
  if (VK_PHYSICAL_DEVICE_TYPE_CPU < DeviceType) {
    AVar1 = ADAPTER_TYPE_UNKNOWN;
  }
  return AVar1;
}

Assistant:

ADAPTER_TYPE VkPhysicalDeviceTypeToAdapterType(VkPhysicalDeviceType DeviceType)
{
    switch (DeviceType)
    {
        // clang-format off
        case VK_PHYSICAL_DEVICE_TYPE_INTEGRATED_GPU: return ADAPTER_TYPE_INTEGRATED;
        case VK_PHYSICAL_DEVICE_TYPE_DISCRETE_GPU:   return ADAPTER_TYPE_DISCRETE;
        case VK_PHYSICAL_DEVICE_TYPE_CPU:            return ADAPTER_TYPE_SOFTWARE;
        case VK_PHYSICAL_DEVICE_TYPE_OTHER:
        default:                                     return ADAPTER_TYPE_UNKNOWN;
            // clang-format on
    }
}